

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_rldimi(DisasContext_conflict10 *ctx,int mbn,int shn)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i64 ret;
  TCGv_i64 arg2;
  uint uVar1;
  TCGTemp *ts;
  uint ofs;
  uint uVar2;
  uintptr_t o;
  TCGv_i64 ret_00;
  ulong arg2_00;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  ret = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0xd & 0xf8));
  arg2 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(uVar1 >> 0x12 & 0xf8));
  ofs = shn << 5 | uVar1 >> 0xb & 0x1f;
  uVar2 = mbn << 5 | uVar1 >> 6 & 0x1f;
  uVar1 = 0x3f - ofs;
  if (uVar1 < uVar2) {
    if (ofs == 0) {
      arg2_00 = 0xffffffffffffffff >> ((byte)uVar2 & 0x3f);
    }
    else {
      arg2_00 = 0x7fffffffffffffffU >> ((byte)uVar1 & 0x3f) ^
                0xffffffffffffffffU >> ((byte)uVar2 & 0x3f);
      if (uVar1 < uVar2) {
        arg2_00 = ~arg2_00;
      }
    }
    ts = tcg_temp_new_internal_ppc64(tcg_ctx,TCG_TYPE_I64,false);
    ret_00 = (TCGv_i64)((long)ts - (long)tcg_ctx);
    tcg_gen_rotli_i64_ppc64(tcg_ctx,ret_00,arg2,ofs);
    tcg_gen_andi_i64_ppc64(tcg_ctx,ret_00,ret_00,arg2_00);
    tcg_gen_andi_i64_ppc64(tcg_ctx,ret,ret,~arg2_00);
    tcg_gen_op3_ppc64(tcg_ctx,INDEX_op_or_i64,(TCGArg)(ret + (long)&tcg_ctx->pool_cur),
                      (TCGArg)(ret + (long)&tcg_ctx->pool_cur),(TCGArg)ts);
    tcg_temp_free_internal_ppc64(tcg_ctx,ts);
  }
  else {
    tcg_gen_deposit_i64_ppc64(tcg_ctx,ret,ret,arg2,ofs,(uVar1 - uVar2) + 1);
  }
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  gen_set_Rc0(ctx,ret);
  return;
}

Assistant:

static void gen_rldimi(DisasContext *ctx, int mbn, int shn)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t_ra = cpu_gpr[rA(ctx->opcode)];
    TCGv t_rs = cpu_gpr[rS(ctx->opcode)];
    uint32_t sh = SH(ctx->opcode) | (shn << 5);
    uint32_t mb = MB(ctx->opcode) | (mbn << 5);
    uint32_t me = 63 - sh;

    if (mb <= me) {
        tcg_gen_deposit_tl(tcg_ctx, t_ra, t_ra, t_rs, sh, me - mb + 1);
    } else {
        target_ulong mask = MASK(mb, me);
        TCGv t1 = tcg_temp_new(tcg_ctx);

        tcg_gen_rotli_tl(tcg_ctx, t1, t_rs, sh);
        tcg_gen_andi_tl(tcg_ctx, t1, t1, mask);
        tcg_gen_andi_tl(tcg_ctx, t_ra, t_ra, ~mask);
        tcg_gen_or_tl(tcg_ctx, t_ra, t_ra, t1);
        tcg_temp_free(tcg_ctx, t1);
    }
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, t_ra);
    }
}